

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O3

void __thiscall fd_dispatcher::fd_dispatcher(fd_dispatcher *this,int port,size_t thread_cnt)

{
  pointer pwVar1;
  vector<worker,_std::allocator<worker>_> workers;
  pair<ranger::event::tcp_connection,_ranger::event::tcp_connection> conn_pair;
  vector<worker,_std::allocator<worker>_> local_e8;
  pointer local_d0;
  undefined1 local_c8 [72];
  tcp_connection local_80;
  
  ranger::event::dispatcher::dispatcher(&this->m_disp);
  ranger::event::endpoint::endpoint((endpoint *)local_c8,port);
  ranger::event::tcp_acceptor::tcp_acceptor(&this->m_acc,&this->m_disp,(endpoint *)local_c8,-1);
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_worker_idx = 0;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._0_8_ = this;
  std::function<bool(ranger::event::tcp_acceptor&,int)>::operator=
            ((function<bool(ranger::event::tcp_acceptor&,int)> *)&(this->m_acc).m_event_handler,
             (anon_class_8_1_8991fb9c *)local_c8);
  std::vector<worker,_std::allocator<worker>_>::vector
            (&local_e8,thread_cnt,(allocator_type *)local_c8);
  if (local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pwVar1 = local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      ranger::event::tcp_connection::create_pair((dispatcher *)local_c8,&this->m_disp);
      std::function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>
      ::operator=((function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>
                   *)(local_c8 + 0x20),(anon_class_1_0_00000001 *)&local_d0);
      ranger::event::tcp_connection::operator=(&pwVar1->m_external_conn,(tcp_connection *)local_c8);
      ranger::event::tcp_connection::operator=(&pwVar1->m_internal_conn,&local_80);
      local_d0 = pwVar1;
      std::function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>
      ::operator=((function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>
                   *)&(pwVar1->m_internal_conn).m_event_handler,(anon_class_8_1_8991fb9c *)&local_d0
                 );
      ranger::event::tcp_connection::~tcp_connection(&local_80);
      ranger::event::tcp_connection::~tcp_connection((tcp_connection *)local_c8);
      pwVar1 = pwVar1 + 1;
    } while (pwVar1 != local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_c8._16_8_ =
       (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_c8._0_8_ =
       (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8._8_8_ =
       (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<worker,_std::allocator<worker>_>::~vector
            ((vector<worker,_std::allocator<worker>_> *)local_c8);
  std::vector<worker,_std::allocator<worker>_>::~vector(&local_e8);
  return;
}

Assistant:

fd_dispatcher(int port, size_t thread_cnt)
		: m_acc(m_disp, ranger::event::endpoint(port)) {
		m_acc.set_event_handler([this] (ranger::event::tcp_acceptor& acc, int fd) {
			return m_workers[m_worker_idx++ % m_workers.size()].take_fd(fd);
		});

		decltype(m_workers) workers(thread_cnt);
		for (auto i = workers.begin(); i != workers.end(); ++i) {
			auto conn_pair = ranger::event::tcp_connection::create_pair(m_disp, i->event_dispatcher());
			conn_pair.first.set_event_handler([] (ranger::event::tcp_connection& conn, ranger::event::tcp_connection::event_code what) {
				switch (what) {
				case ranger::event::tcp_connection::event_code::timeout:
				case ranger::event::tcp_connection::event_code::error:
				case ranger::event::tcp_connection::event_code::eof:
					conn.close();
					break;
				default:
					break;
				}
			});

			i->set_external_connection(std::move(conn_pair.first));
			i->set_internal_connection(std::move(conn_pair.second));
		}

		m_workers = std::move(workers);
	}